

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O1

unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true> __thiscall
duckdb::Transformer::DummyOnConflictClause
          (Transformer *this,PGOnConflictActionAlias type,string *relname)

{
  Transformer *pTVar1;
  pointer pOVar2;
  InternalException *this_00;
  templated_unique_single_t *result;
  undefined4 in_register_00000034;
  string local_40;
  
  if ((int)relname == 2) {
    pTVar1 = (Transformer *)operator_new(0x30);
    OnConflictInfo::OnConflictInfo((OnConflictInfo *)pTVar1);
    (this->parent).ptr = pTVar1;
    pOVar2 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    pOVar2->action_type = NOTHING;
  }
  else {
    if ((int)relname != 1) {
      this_00 = (InternalException *)
                __cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,type));
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Type not implemented for PGOnConflictActionAlias","");
      InternalException::InternalException(this_00,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pTVar1 = (Transformer *)operator_new(0x30);
    OnConflictInfo::OnConflictInfo((OnConflictInfo *)pTVar1);
    (this->parent).ptr = pTVar1;
    pOVar2 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    pOVar2->action_type = REPLACE;
  }
  return (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)
         (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)this;
}

Assistant:

unique_ptr<OnConflictInfo> Transformer::DummyOnConflictClause(duckdb_libpgquery::PGOnConflictActionAlias type,
                                                              const string &relname) {
	switch (type) {
	case duckdb_libpgquery::PGOnConflictActionAlias::PG_ONCONFLICT_ALIAS_REPLACE: {
		// This can not be fully resolved yet until the bind stage
		auto result = make_uniq<OnConflictInfo>();
		result->action_type = OnConflictAction::REPLACE;
		return result;
	}
	case duckdb_libpgquery::PGOnConflictActionAlias::PG_ONCONFLICT_ALIAS_IGNORE: {
		// We can just fully replace this with DO NOTHING, and be done with it
		auto result = make_uniq<OnConflictInfo>();
		result->action_type = OnConflictAction::NOTHING;
		return result;
	}
	default: {
		throw InternalException("Type not implemented for PGOnConflictActionAlias");
	}
	}
}